

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O1

bool xercesc_4_0::XMLChar1_0::isValidNCName(XMLCh *toCheck,XMLSize_t count)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  bool bVar3;
  
  if (((count == 0) || ((ulong)(ushort)*toCheck == 0x3a)) ||
     (((&fgCharCharsTable1_0)[(ushort)*toCheck] & 2) == 0)) {
    bVar3 = false;
  }
  else {
    pXVar2 = toCheck + 1;
    do {
      bVar3 = toCheck + count <= pXVar2;
      if (bVar3) {
        return bVar3;
      }
      XVar1 = *pXVar2;
      pXVar2 = pXVar2 + 1;
    } while (((&fgCharCharsTable1_0)[(ushort)XVar1] & 1) != 0);
  }
  return bVar3;
}

Assistant:

bool XMLChar1_0::isValidNCName(const   XMLCh* const    toCheck
                               , const XMLSize_t       count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    if (*curCh== chColon || !(fgCharCharsTable1_0[*curCh++] & gFirstNameCharMask))
        return false;

    while (curCh < endPtr)
    {
        if (!(fgCharCharsTable1_0[*curCh++] & gNCNameCharMask))
            return false;
    }
    return true;
}